

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,Header *aHeader,ByteArray *aBuf,size_t *aOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uchar uVar3;
  char cVar4;
  ushort uVar5;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar6;
  pointer puVar7;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *paVar8;
  char *pcVar9;
  byte bVar10;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar11;
  byte bVar12;
  char *pcVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  writer local_c8;
  string local_c0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_a0;
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pvVar6 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)*aOffset;
  puVar7 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar11 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
            ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + -(long)puVar7);
  local_a0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )paVar1;
  if (pvVar6 < pvVar11) {
    if ((value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
        ((long)&pvVar6->field_0 + 1U) < pvVar11) {
      if ((value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
          ((long)&pvVar6->field_0 + 3U) < pvVar11) {
        bVar2 = *(byte *)((long)&pvVar6->field_0 + (long)puVar7);
        uVar3 = *(pointer)((long)&pvVar6->field_0 + (long)(puVar7 + 1));
        uVar5 = *(ushort *)((long)&pvVar6->field_0 + (long)(puVar7 + 2));
        local_a0.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
             ((long)&pvVar6->field_0 + 4);
        if ((bVar2 & 0xf) != 0) {
          aVar14.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               ((long)&(local_a0.values_)->field_0 + (ulong)(bVar2 & 0xf));
          if (pvVar11 < aVar14.values_) {
            local_68.types_[0] = none_type;
            pcVar9 = "premature end of CoAP message header";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "premature end of CoAP message header";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
            local_68.parse_funcs_[0] = (parse_func)0x0;
            local_c8.handler_ = &local_68;
            local_a0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )paVar1;
            local_68.context_.types_ = local_68.types_;
            do {
              cVar4 = *pcVar9;
              pcVar13 = pcVar9;
              while (cVar4 != '{') {
                pcVar13 = pcVar13 + 1;
                if (pcVar13 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&local_c8,pcVar9,"");
                  goto LAB_001f3a47;
                }
                cVar4 = *pcVar13;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&local_c8,pcVar9,pcVar13);
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar13,"",&local_68);
            } while (pcVar9 != "");
LAB_001f3a47:
            args_02.field_1.values_ = aVar14.values_;
            args_02.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_c0,(v10 *)"premature end of CoAP message header",
                       (string_view)ZEXT816(0x24),args_02);
            local_98 = kBadFormat;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            goto LAB_001f3a8f;
          }
          paVar8 = &(local_a0.values_)->field_0;
          bVar12 = (byte)(bVar2 & 0xf);
          bVar10 = 8;
          if (bVar12 < 8) {
            bVar10 = bVar12;
          }
          local_a0.values_ = aVar14.values_;
          memcpy(&local_70,(pointer)((long)paVar8 + (long)puVar7),(ulong)bVar10);
          pvVar11 = local_70;
        }
        *(byte *)aHeader = bVar2 >> 2 & 0xc | bVar2 >> 6 | bVar2 << 4;
        aHeader->mCode = uVar3;
        aHeader->mMessageId = uVar5 << 8 | uVar5 >> 8;
        *(value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **)aHeader->mToken =
             pvVar11;
        *aOffset = (size_t)local_a0;
        return __return_storage_ptr__;
      }
      local_68.types_[0] = none_type;
      pcVar9 = "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_c8.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        cVar4 = *pcVar9;
        pcVar13 = pcVar9;
        while (cVar4 != '{') {
          pcVar13 = pcVar13 + 1;
          if (pcVar13 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_c8,pcVar9,"");
            goto LAB_001f3977;
          }
          cVar4 = *pcVar13;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c8,pcVar9,pcVar13);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar13,"",&local_68);
      } while (pcVar9 != "");
LAB_001f3977:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_01);
      local_98 = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
    else {
      local_68.types_[0] = none_type;
      pcVar9 = "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of CoAP message header";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_c8.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        cVar4 = *pcVar9;
        pcVar13 = pcVar9;
        while (cVar4 != '{') {
          pcVar13 = pcVar13 + 1;
          if (pcVar13 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_c8,pcVar9,"");
            goto LAB_001f389a;
          }
          cVar4 = *pcVar13;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c8,pcVar9,pcVar13);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar13,"",&local_68);
      } while (pcVar9 != "");
LAB_001f389a:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
                 args_00);
      local_98 = kBadFormat;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
  }
  else {
    local_68.types_[0] = none_type;
    pcVar9 = "premature end of CoAP message header";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of CoAP message header";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_c8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar4 = *pcVar9;
      pcVar13 = pcVar9;
      while (cVar4 != '{') {
        pcVar13 = pcVar13 + 1;
        if (pcVar13 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_c8,pcVar9,"");
          goto LAB_001f37bd;
        }
        cVar4 = *pcVar13;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_c8,pcVar9,pcVar13);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar13,"",&local_68);
    } while (pcVar9 != "");
LAB_001f37bd:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"premature end of CoAP message header",(string_view)ZEXT816(0x24),
               args);
    local_98 = kBadFormat;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
  }
LAB_001f3a8f:
  __return_storage_ptr__->mCode = local_98;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(Header &aHeader, const ByteArray &aBuf, size_t &aOffset)
{
    Error  error;
    Header header;
    size_t offset = aOffset;

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mVersion     = aBuf[offset] >> 6;
    header.mType        = aBuf[offset] >> 4;
    header.mTokenLength = aBuf[offset++];

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mCode = aBuf[offset++];

    VerifyOrExit(offset + 1 < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mMessageId = aBuf[offset++];
    header.mMessageId = (header.mMessageId << 8) | aBuf[offset++];

    if (header.mTokenLength != 0)
    {
        VerifyOrExit(offset + header.mTokenLength <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
        memcpy(header.mToken, &aBuf[offset], std::min(header.mTokenLength, kMaxTokenLength));
        offset += header.mTokenLength;
    }

    aHeader = header;
    aOffset = offset;

exit:
    return error;
}